

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strs.c
# Opt level: O3

size_t nni_strlcpy(char *dst,char *src,size_t len)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  char *pcVar5;
  
  uVar2 = 1;
  do {
    uVar3 = uVar2;
    cVar1 = src[uVar3 - 1];
    if (uVar3 < len) {
      pcVar5 = dst + 1;
      cVar4 = cVar1;
LAB_00116c32:
      *dst = cVar4;
      dst = pcVar5;
    }
    else if (uVar3 == len) {
      cVar4 = '\0';
      pcVar5 = dst;
      goto LAB_00116c32;
    }
    uVar2 = uVar3 + 1;
    if (cVar1 == '\0') {
      return uVar3 - 1;
    }
  } while( true );
}

Assistant:

size_t
nni_strlcpy(char *dst, const char *src, size_t len)
{
#ifdef NNG_HAVE_STRLCPY
	return (strlcpy(dst, src, len));
#else
	size_t n;
	char   c;

	n = 0;
	do {
		c = *src++;
		n++;
		if (n < len) {
			*dst++ = c;
		} else if (n == len) {
			*dst = '\0';
		}
	} while (c);
	return (n - 1);
#endif
}